

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

int Ssw_RarSignalFilter(Aig_Man_t *pAig,Ssw_RarPars_t *pPars)

{
  undefined1 *puVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  abctime aVar6;
  abctime aVar7;
  Ssw_Cla_t *p;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  Vec_Int_t *pVVar11;
  Ssw_Cla_t *pSVar12;
  Abc_Cex_t *pAVar13;
  int Fill;
  abctime time;
  char *pcVar14;
  abctime time_00;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  Aig_Man_t *pAVar19;
  int fVerbose;
  code *pcVar20;
  int iVar21;
  int local_54;
  int local_44;
  long local_38;
  
  pAVar19 = pAig;
  aVar6 = Abc_Clock();
  iVar4 = (int)pAVar19;
  iVar3 = pPars->TimeOut;
  if ((long)iVar3 == 0) {
    local_38 = 0;
  }
  else {
    aVar7 = Abc_Clock();
    local_38 = aVar7 + (long)iVar3 * 1000000;
  }
  if (pAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                  ,0x4cc,"int Ssw_RarSignalFilter(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  if (pAig->nConstrs != 0) {
    __assert_fail("Aig_ManConstrNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                  ,0x4cd,"int Ssw_RarSignalFilter(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  if (pAig->nObjs[6] + pAig->nObjs[5] == 0) {
    return -1;
  }
  local_44 = pPars->nRandSeed;
  if (pPars->fMiter != 0) {
    pAVar19 = pAig;
    iVar3 = Ssw_RarCheckTrivial(pAig,1);
    iVar4 = (int)pAVar19;
    if (iVar3 != 0) {
      return 0;
    }
  }
  if (pPars->fVerbose != 0) {
    Abc_Print(iVar4,
              "Rarity equiv filtering with %d words, %d frames, %d rounds, %d seed, and %d sec timeout.\n"
              ,(ulong)(uint)pPars->nWords,(ulong)(uint)pPars->nFrames,(ulong)(uint)pPars->nRounds,
              (ulong)(uint)pPars->nRandSeed,pPars->TimeOut);
  }
  Ssw_RarManPrepareRandom(local_44);
  p = (Ssw_Cla_t *)Ssw_RarManStart(pAig,pPars);
  lVar2._0_4_ = p->nCands1;
  lVar2._4_4_ = p->nLits;
  if (lVar2 != 0) {
    __assert_fail("p->vInits == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                  ,0x4dd,"int Ssw_RarSignalFilter(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  pAVar13 = pPars->pCex;
  if (pAVar13 == (Abc_Cex_t *)0x0) {
    pVVar11 = Vec_IntStart(pAig->nRegs);
    *(Vec_Int_t **)&p->nCands1 = pVVar11;
  }
  else {
    for (uVar15 = 0; (int)uVar15 < pAig->nRegs; uVar15 = uVar15 + 1) {
      pvVar8 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + uVar15);
      *(ulong *)((long)pvVar8 + 0x18) =
           *(ulong *)((long)pvVar8 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((uint)(&pAVar13[1].iPo)[uVar15 >> 5] >> ((byte)uVar15 & 0x1f) & 1) << 5);
    }
    iVar3 = pAVar13->nRegs;
    for (iVar4 = 0; iVar4 <= pAVar13->iFrame; iVar4 = iVar4 + 1) {
      puVar1 = &pAig->pConst1->field_0x18;
      *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
      for (iVar21 = 0; iVar16 = iVar3 + iVar21, iVar21 < pAig->nTruePis; iVar21 = iVar21 + 1) {
        pvVar8 = Vec_PtrEntry(pAig->vCis,iVar21);
        *(ulong *)((long)pvVar8 + 0x18) =
             *(ulong *)((long)pvVar8 + 0x18) & 0xffffffffffffffdf |
             (ulong)(((uint)(&pAVar13[1].iPo)[iVar16 >> 5] >> ((byte)iVar16 & 0x1f) & 1) << 5);
      }
      for (iVar3 = 0; iVar3 < pAig->nRegs; iVar3 = iVar3 + 1) {
        pAVar9 = Saig_ManLi(pAig,iVar3);
        pAVar10 = Saig_ManLo(pAig,iVar3);
        *(ulong *)&pAVar10->field_0x18 =
             *(ulong *)&pAVar10->field_0x18 & 0xffffffffffffffdf |
             (ulong)((uint)*(undefined8 *)&pAVar9->field_0x18 & 0x20);
      }
      for (iVar3 = 0; iVar3 < pAig->vObjs->nSize; iVar3 = iVar3 + 1) {
        pvVar8 = Vec_PtrEntry(pAig->vObjs,iVar3);
        if ((pvVar8 != (void *)0x0) &&
           (0xfffffffd < ((uint)*(ulong *)((long)pvVar8 + 0x18) & 7) - 7)) {
          *(ulong *)((long)pvVar8 + 0x18) =
               *(ulong *)((long)pvVar8 + 0x18) & 0xffffffffffffffdf |
               (ulong)((((uint)*(ulong *)((long)pvVar8 + 0x10) ^
                        *(uint *)((*(ulong *)((long)pvVar8 + 0x10) & 0xfffffffffffffffe) + 0x18) >>
                        5) & ((uint)*(ulong *)((long)pvVar8 + 8) ^
                             *(uint *)((*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe) + 0x18)
                             >> 5) & 1) << 5);
        }
      }
      for (iVar3 = 0; iVar3 < pAig->vCos->nSize; iVar3 = iVar3 + 1) {
        pvVar8 = Vec_PtrEntry(pAig->vCos,iVar3);
        *(ulong *)((long)pvVar8 + 0x18) =
             *(ulong *)((long)pvVar8 + 0x18) & 0xffffffffffffffdf |
             (ulong)(((int)*(ulong *)((long)pvVar8 + 8) << 5 ^
                     *(uint *)((*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20);
      }
      iVar3 = iVar16;
    }
    if (iVar3 != pAVar13->nBits) {
      __assert_fail("iBit == pCex->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                    ,0x390,"Vec_Int_t *Ssw_RarFindStartingState(Aig_Man_t *, Abc_Cex_t *)");
    }
    pVVar11 = Vec_IntAlloc(pAig->nRegs);
    for (iVar3 = 0; iVar3 < pAig->nRegs; iVar3 = iVar3 + 1) {
      pvVar8 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar3);
      Vec_IntPush(pVVar11,*(uint *)((long)pvVar8 + 0x18) >> 5 & 1);
    }
    pAVar19 = pAig;
    Aig_ManCleanMarkB(pAig);
    *(Vec_Int_t **)&p->nCands1 = pVVar11;
    Abc_Print((int)pAVar19,
              "Beginning simulation from the state derived using the counter-example.\n");
  }
  for (iVar3 = 1; iVar3 < pPars->nWords; iVar3 = iVar3 + 1) {
    for (iVar4 = 0; iVar4 < pAig->nRegs; iVar4 = iVar4 + 1) {
      pVVar11 = *(Vec_Int_t **)&p->nCands1;
      iVar21 = Vec_IntEntry(pVVar11,iVar4);
      Vec_IntPush(pVVar11,iVar21);
    }
  }
  if (*(int *)(*(long *)&p->nCands1 + 4) != pPars->nWords * pAig->nRegs) {
    __assert_fail("Vec_IntSize(p->vInits) == Aig_ManRegNum(pAig) * pPars->nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                  ,0x4e9,"int Ssw_RarSignalFilter(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  if (pAig->pReprs == (Aig_Obj_t **)0x0) {
    pSVar12 = Ssw_ClassesPrepareSimple(pAig,pPars->fLatchOnly,0);
  }
  else {
    pSVar12 = Ssw_ClassesPrepareFromReprs(pAig);
  }
  *(Ssw_Cla_t **)&p->fConstCorr = pSVar12;
  pcVar20 = Ssw_RarManObjsAreEqual;
  Ssw_ClassesSetData(pSVar12,p,Ssw_RarManObjHashWord,Ssw_RarManObjIsConst,Ssw_RarManObjsAreEqual);
  if (pPars->fVerbose != 0) {
    Abc_Print((int)pSVar12,"Initial  :  ");
    pSVar12 = *(Ssw_Cla_t **)&p->fConstCorr;
    Ssw_ClassesPrint(pSVar12,0);
  }
  iVar3 = -1;
  uVar18 = 0xffffffff;
  uVar17 = 0;
  local_54 = 0;
  do {
    iVar21 = (int)pSVar12;
    iVar4 = (int)uVar17;
    if ((pPars->nRounds != 0) && (pPars->nRounds <= pPars->nRestart * local_54 + iVar4))
    goto LAB_00567994;
    iVar21 = Ssw_ClassesCand1Num(*(Ssw_Cla_t **)&p->fConstCorr);
    if (iVar21 == 0) {
      pSVar12 = *(Ssw_Cla_t **)&p->fConstCorr;
      iVar16 = Ssw_ClassesClassNum(pSVar12);
      iVar21 = (int)pSVar12;
      if (iVar16 == 0) {
        Abc_Print(iVar21,"All equivalences are refined away.\n");
LAB_00567994:
        if ((iVar4 == pPars->nRounds) && ((int)uVar18 == pPars->nFrames)) {
          if (pPars->fVerbose == 0) {
            iVar16 = Abc_FrameIsBatchMode();
            pcVar14 = "\n";
            if (iVar16 == 0) {
              pcVar14 = "\r";
            }
            Abc_Print(iVar21,"%s",pcVar14);
            uVar18 = (ulong)(uint)pPars->nFrames;
          }
          pcVar14 = "Simulation of %d frames for %d rounds with %d restarts did not assert POs.    "
          ;
          Abc_Print(iVar21,
                    "Simulation of %d frames for %d rounds with %d restarts did not assert POs.    "
                    ,uVar18,(ulong)(uint)(pPars->nRestart * local_54 + iVar4));
          aVar7 = Abc_Clock();
          Abc_PrintTime((int)aVar7 - (int)aVar6,pcVar14,time_00);
        }
        Ssw_RarManStop((Ssw_RarMan_t *)p);
        return iVar3;
      }
    }
    uVar18 = 0;
    while (iVar16 = (int)uVar18, iVar16 < pPars->nFrames) {
      if (iVar16 == 0) {
        pVVar11 = *(Vec_Int_t **)&p->nCands1;
      }
      else {
        pVVar11 = (Vec_Int_t *)0x0;
      }
      pSVar12 = p;
      Ssw_RarManSimulate((Ssw_RarMan_t *)p,pVVar11,1,(uint)(iVar16 == 0 && iVar4 == 0));
      iVar21 = (int)pSVar12;
      if (pPars->fMiter != 0) {
        pSVar12 = p;
        iVar5 = Ssw_RarManCheckNonConstOutputs((Ssw_RarMan_t *)p,-1,0);
        fVerbose = (int)pcVar20;
        iVar21 = (int)pSVar12;
        if (iVar5 != 0) {
          if (pPars->fVerbose == 0) {
            iVar3 = Abc_FrameIsBatchMode();
            pcVar14 = "\n";
            if (iVar3 == 0) {
              pcVar14 = "\r";
            }
            Abc_Print(iVar21,"%s",pcVar14);
            if (pPars->fVerbose != 0) goto LAB_005678b5;
          }
          else {
LAB_005678b5:
            fVerbose = local_54;
            Abc_Print(iVar21,"Simulated %d frames for %d rounds with %d restarts.\n",
                      (ulong)(uint)pPars->nFrames,(ulong)(uint)(pPars->nRestart * local_54 + iVar4))
            ;
          }
          Ssw_RarManPrepareRandom(local_44);
          Abc_CexFree(pAig->pSeqModel);
          pSVar12 = p;
          pAVar13 = Ssw_RarDeriveCex((Ssw_RarMan_t *)p,*(int *)&p->pAig->pName * iVar4 + iVar16,
                                     *(int *)&p->pFuncNodeIsConst,
                                     *(int *)((long)&p->pFuncNodeIsConst + 4),fVerbose);
          pAig->pSeqModel = pAVar13;
          pcVar14 = "Output %d of miter \"%s\" was asserted in frame %d.  ";
          iVar3 = 0;
          Abc_Print((int)pSVar12,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                    (ulong)(uint)pAVar13->iPo,pAig->pName,(ulong)(uint)pAVar13->iFrame);
          aVar7 = Abc_Clock();
          iVar21 = (int)aVar7 - (int)aVar6;
          Abc_PrintTime(iVar21,pcVar14,time);
          goto LAB_00567994;
        }
      }
      if ((pPars->TimeOut != 0) && (aVar7 = Abc_Clock(), local_38 < aVar7)) {
        if (pPars->fVerbose != 0) {
          Abc_Print(iVar21,"\n");
        }
        Abc_Print(iVar21,"Simulated %d frames for %d rounds with %d restarts.  ",
                  (ulong)(uint)pPars->nFrames,(ulong)(uint)(pPars->nRestart * local_54 + iVar4));
        Abc_Print(iVar21,"Reached timeout (%d sec).\n",(ulong)(uint)pPars->TimeOut);
        goto LAB_00567994;
      }
      uVar18 = (ulong)(iVar16 + 1);
    }
    if ((pPars->pCex == (Abc_Cex_t *)0x0) && (iVar4 == pPars->nRestart && pPars->nRestart != 0)) {
      local_44 = (local_44 + 1) % 1000;
      Ssw_RarManPrepareRandom(local_44);
      pSVar12 = *(Ssw_Cla_t **)&p->nCands1;
      Vec_IntFill((Vec_Int_t *)pSVar12,pPars->nWords * pAig->nRegs,Fill);
      local_54 = local_54 + 1;
      *(undefined4 *)(p->pFuncNodeHash + 4) = 0;
      uVar17 = 0xffffffff;
    }
    else {
      pSVar12 = p;
      Ssw_RarTransferPatterns((Ssw_RarMan_t *)p,*(Vec_Int_t **)&p->nCands1);
    }
    if (pPars->fVerbose == 0) {
      Abc_Print((int)pSVar12,".");
    }
    else {
      Abc_Print((int)pSVar12,"Round %3d:  ",uVar17);
      pSVar12 = *(Ssw_Cla_t **)&p->fConstCorr;
      Ssw_ClassesPrint(pSVar12,0);
    }
    uVar17 = (ulong)((int)uVar17 + 1);
  } while( true );
}

Assistant:

int Ssw_RarSignalFilter( Aig_Man_t * pAig, Ssw_RarPars_t * pPars )
{
    Ssw_RarMan_t * p;
    int r, f = -1, i, k;
    abctime clkTotal = Abc_Clock();
    abctime nTimeToStop = pPars->TimeOut ? pPars->TimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    int nNumRestart = 0;
    int nSavedSeed = pPars->nRandSeed;
    int RetValue = -1;
    assert( Aig_ManRegNum(pAig) > 0 );
    assert( Aig_ManConstrNum(pAig) == 0 );
    // consider the case of empty AIG
    if ( Aig_ManNodeNum(pAig) == 0 )
        return -1;
    // check trivially SAT miters
    if ( pPars->fMiter && Ssw_RarCheckTrivial( pAig, 1 ) )
        return 0;
    if ( pPars->fVerbose )
        Abc_Print( 1, "Rarity equiv filtering with %d words, %d frames, %d rounds, %d seed, and %d sec timeout.\n",
            pPars->nWords, pPars->nFrames, pPars->nRounds, pPars->nRandSeed, pPars->TimeOut );
    // reset random numbers
    Ssw_RarManPrepareRandom( nSavedSeed );

    // create manager
    p = Ssw_RarManStart( pAig, pPars );
    // compute starting state if needed
    assert( p->vInits == NULL );
    if ( pPars->pCex )
    {
        p->vInits = Ssw_RarFindStartingState( pAig, pPars->pCex );
        Abc_Print( 1, "Beginning simulation from the state derived using the counter-example.\n" );
    }
    else
        p->vInits = Vec_IntStart( Aig_ManRegNum(pAig) );
    // duplicate the array
    for ( i = 1; i < pPars->nWords; i++ )
        for ( k = 0; k < Aig_ManRegNum(pAig); k++ )
            Vec_IntPush( p->vInits, Vec_IntEntry(p->vInits, k) );
    assert( Vec_IntSize(p->vInits) == Aig_ManRegNum(pAig) * pPars->nWords );

    // create trivial equivalence classes with all nodes being candidates for constant 1
    if ( pAig->pReprs == NULL )
        p->ppClasses = Ssw_ClassesPrepareSimple( pAig, pPars->fLatchOnly, 0 );
    else
        p->ppClasses = Ssw_ClassesPrepareFromReprs( pAig );
    Ssw_ClassesSetData( p->ppClasses, p, Ssw_RarManObjHashWord, Ssw_RarManObjIsConst, Ssw_RarManObjsAreEqual );
    // print the stats
    if ( pPars->fVerbose )
    {
        Abc_Print( 1, "Initial  :  " );
        Ssw_ClassesPrint( p->ppClasses, 0 );
    }
    // refine classes using BMC
    for ( r = 0; !pPars->nRounds || (nNumRestart * pPars->nRestart + r < pPars->nRounds); r++ )
    {
        // start filtering equivalence classes
        if ( Ssw_ClassesCand1Num(p->ppClasses) == 0 && Ssw_ClassesClassNum(p->ppClasses) == 0 )
        {
            Abc_Print( 1, "All equivalences are refined away.\n" );
            break;
        }
        // simulate
        for ( f = 0; f < pPars->nFrames; f++ )
        {
            Ssw_RarManSimulate( p, f ? NULL : p->vInits, 1, !r && !f );
            if ( pPars->fMiter && Ssw_RarManCheckNonConstOutputs(p, -1, 0) )
            {
                if ( !pPars->fVerbose )
                    Abc_Print( 1, "%s", Abc_FrameIsBatchMode() ? "\n" : "\r" );
//                Abc_Print( 1, "Simulation asserted a PO in frame f: %d <= f < %d.\n", r * pPars->nFrames, (r+1) * pPars->nFrames );
                if ( pPars->fVerbose )
                    Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts.\n", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
                Ssw_RarManPrepareRandom( nSavedSeed );
                Abc_CexFree( pAig->pSeqModel );
                pAig->pSeqModel = Ssw_RarDeriveCex( p, r * p->pPars->nFrames + f, p->iFailPo, p->iFailPat, 1 );
                // print final report
                Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", pAig->pSeqModel->iPo, pAig->pName, pAig->pSeqModel->iFrame );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
                RetValue = 0;
                goto finish;
            }
            // check timeout
            if ( pPars->TimeOut && Abc_Clock() > nTimeToStop )
            {
                if ( pPars->fVerbose ) Abc_Print( 1, "\n" );
                Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts.  ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
                Abc_Print( 1, "Reached timeout (%d sec).\n",  pPars->TimeOut );
                goto finish;
            }
        }
        // get initialization patterns
        if ( pPars->pCex == NULL && pPars->nRestart && r == pPars->nRestart )
        {
            r = -1;
            nSavedSeed = (nSavedSeed + 1) % 1000;
            Ssw_RarManPrepareRandom( nSavedSeed );
            Vec_IntFill( p->vInits, Aig_ManRegNum(pAig) * pPars->nWords, 0 );
            nNumRestart++;
            Vec_IntClear( p->vPatBests );
            // clean rarity info
//            memset( p->pRarity, 0, sizeof(int) * (1 << nBinSize) * p->nGroups );
        }
        else
            Ssw_RarTransferPatterns( p, p->vInits );
        // printout
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "Round %3d:  ", r );
            Ssw_ClassesPrint( p->ppClasses, 0 );
        }
        else
        {
            Abc_Print( 1, "." );
        }
    }
finish:
    // report
    if ( r == pPars->nRounds && f == pPars->nFrames )
    {
        if ( !pPars->fVerbose )
            Abc_Print( 1, "%s", Abc_FrameIsBatchMode() ? "\n" : "\r" );
        Abc_Print( 1, "Simulation of %d frames for %d rounds with %d restarts did not assert POs.    ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    }
    // cleanup
    Ssw_RarManStop( p );
    return RetValue;
}